

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ** __thiscall ImGuiStorage::GetVoidPtrRef(ImGuiStorage *this,ImGuiID key,void *default_val)

{
  ImGuiStoragePair *pIVar1;
  void *in_RDX;
  ImGuiID in_ESI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  ImGuiStoragePair *it;
  ImGuiStoragePair *it_00;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_stack_ffffffffffffffd0;
  ImGuiStoragePair *local_20;
  
  local_20 = LowerBound(in_RDI,in_ESI);
  it_00 = local_20;
  pIVar1 = ImVector<ImGuiStorage::ImGuiStoragePair>::end(in_RDI);
  if ((it_00 == pIVar1) || (local_20->key != in_ESI)) {
    ImGuiStoragePair::ImGuiStoragePair((ImGuiStoragePair *)&stack0xffffffffffffffd0,in_ESI,in_RDX);
    local_20 = ImVector<ImGuiStorage::ImGuiStoragePair>::insert
                         (in_stack_ffffffffffffffd0,it_00,(ImGuiStoragePair *)in_RDI);
  }
  return (void **)&local_20->field_1;
}

Assistant:

void** ImGuiStorage::GetVoidPtrRef(ImGuiID key, void* default_val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, ImGuiStoragePair(key, default_val));
    return &it->val_p;
}